

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void __thiscall
duckdb::StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::
Analyze(StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
        *this,ColumnWriterState *state_p,ColumnWriterState *parent,Vector *vector,idx_t count)

{
  bool bVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  size_type __n;
  idx_t row_idx;
  bool bVar3;
  reference rVar4;
  string_t value;
  
  if (parent == (ColumnWriterState *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = *(uint *)((long)&(parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) != 0
            || (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_p !=
               (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_p;
  }
  __n = (long)(state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(state_p->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start >> 1;
  if (bVar1) {
    count = ((long)(parent->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(parent->definition_levels).
                   super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start >> 1) - __n;
  }
  paVar2 = *(anon_union_16_2_67f50693_for_value **)(vector + 0x20);
  FlatVector::VerifyFlatVector(vector);
  if (*(long *)(vector + 0x28) == 0 && !bVar1) {
    while (bVar1 = count != 0, count = count - 1, bVar1) {
      PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::Insert
                ((PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
                  *)&state_p[2].definition_levels,(string_t)paVar2->pointer);
      state_p[1].parent_null_count = state_p[1].parent_null_count + 1;
      state_p[1].null_count = state_p[1].null_count + (ulong)(paVar2->pointer).length;
      paVar2 = paVar2 + 1;
    }
  }
  else {
    row_idx = 0;
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      if (bVar1) {
        rVar4 = vector<bool,_true>::get<true>(&parent->is_empty,__n);
        if ((*rVar4._M_p & rVar4._M_mask) == 0) goto LAB_002a34e4;
      }
      else {
LAB_002a34e4:
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)(vector + 0x28),row_idx);
        if (bVar3) {
          value.value.pointer.ptr = (char *)*(undefined8 *)((long)paVar2 + row_idx * 0x10 + 8);
          value.value._0_8_ = *(undefined8 *)(paVar2 + row_idx);
          PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::
          Insert((PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
                  *)&state_p[2].definition_levels,value);
          state_p[1].parent_null_count = state_p[1].parent_null_count + 1;
          state_p[1].null_count = state_p[1].null_count + (ulong)paVar2[row_idx].pointer.length;
        }
        row_idx = row_idx + 1;
      }
      __n = __n + 1;
    }
  }
  return;
}

Assistant:

void Analyze(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();

		auto data_ptr = FlatVector::GetData<SRC>(vector);
		idx_t vector_index = 0;

		const bool check_parent_empty = parent && !parent->is_empty.empty();
		const idx_t parent_index = state.definition_levels.size();

		const idx_t vcount =
		    check_parent_empty ? parent->definition_levels.size() - state.definition_levels.size() : count;

		const auto &validity = FlatVector::Validity(vector);

		if (!check_parent_empty && validity.AllValid()) {
			// Fast path
			for (; vector_index < vcount; vector_index++) {
				const auto &src_value = data_ptr[vector_index];
				state.dictionary.Insert(src_value);
				state.total_value_count++;
				state.total_string_size += DlbaEncoder::GetStringSize(src_value);
			}
		} else {
			for (idx_t i = 0; i < vcount; i++) {
				if (check_parent_empty && parent->is_empty[parent_index + i]) {
					continue;
				}
				if (validity.RowIsValid(vector_index)) {
					const auto &src_value = data_ptr[vector_index];
					state.dictionary.Insert(src_value);
					state.total_value_count++;
					state.total_string_size += DlbaEncoder::GetStringSize(src_value);
				}
				vector_index++;
			}
		}
	}